

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O1

void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  int *piVar1;
  void *pvVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint local_40;
  
  uVar5 = pCex->nRegs;
  if (pCex->nBits != (pCex->iFrame + 1) * pCex->nPis + uVar5) {
    __assert_fail("pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSeq.c"
                  ,0x31,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
  }
  if (vInfo->nSize < (int)((pCex->nBits - uVar5) + pAig->nRegs)) {
    __assert_fail("pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSeq.c"
                  ,0x32,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
  }
  if (vInfo->nSize < 2) {
LAB_005ac748:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar9 = (long)vInfo->pArray[1] - (long)*vInfo->pArray;
  bVar3 = 0 < (int)uVar5;
  if (0 < (int)uVar5) {
    if ((pCex[1].iPo & 1) == 0) {
      uVar7 = 1;
      do {
        uVar6 = (uint)uVar7;
        if (uVar5 == uVar6) goto LAB_005ac62d;
        uVar4 = uVar7 >> 5;
        uVar7 = (ulong)(uVar6 + 1);
      } while (((uint)(&pCex[1].iPo)[uVar4] >> (uVar6 & 0x1f) & 1) == 0);
      bVar3 = (int)uVar6 < (int)uVar5;
    }
    if (bVar3) {
      Abc_Print(0,
                "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n"
               );
    }
  }
LAB_005ac62d:
  local_40 = (uint)(uVar9 >> 2);
  if (pAig->nRegs < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      if ((long)vInfo->nSize <= (long)uVar7) goto LAB_005ac748;
      if (0 < (int)local_40) {
        memset(vInfo->pArray[uVar7],0,uVar9 & 0x3fffffffc);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)pAig->nRegs);
  }
  iVar8 = pCex->nRegs;
  if (iVar8 < pCex->nBits) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if ((long)vInfo->nSize <= (long)uVar7) goto LAB_005ac748;
      piVar1 = (int *)vInfo->pArray[uVar7];
      if (0 < (int)local_40) {
        uVar9 = 0;
        do {
          uVar5 = Gia_ManRandom(0);
          piVar1[uVar9] = uVar5;
          uVar9 = uVar9 + 1;
        } while ((local_40 & 0x7fffffff) != uVar9);
      }
      uVar7 = uVar7 + 1;
      *piVar1 = *piVar1 * 4 + ((uint)(&pCex[1].iPo)[iVar8 >> 5] >> ((byte)iVar8 & 0x1f) & 1) * 2;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pCex->nBits);
  }
  if ((int)uVar7 < vInfo->nSize) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if (0 < (int)local_40) {
        pvVar2 = vInfo->pArray[uVar7];
        uVar9 = 0;
        do {
          uVar5 = Gia_ManRandom(0);
          *(uint *)((long)pvVar2 + uVar9 * 4) = uVar5;
          uVar9 = uVar9 + 1;
        } while ((local_40 & 0x7fffffff) != uVar9);
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < vInfo->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sets register values from the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManSeqDeriveInfoFromCex( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, i, w, nWords;
    assert( pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1) );
    assert( pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
/*
    // user register values
    assert( pCex->nRegs == Gia_ManRegNum(pAig) );
    for ( k = 0; k < pCex->nRegs; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Abc_InfoHasBit( pCex->pData, k )? ~0 : 0;
    }
*/
    // print warning about register values
    for ( k = 0; k < pCex->nRegs; k++ )
        if ( Abc_InfoHasBit( pCex->pData, k ) )
            break;
    if ( k < pCex->nRegs )
        Abc_Print( 0, "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n" );

    // assign zero register values
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k++ );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
        // set simulation pattern and make sure it is second (first will be erased during simulation)
        pInfo[0] = (pInfo[0] << 1) | Abc_InfoHasBit( pCex->pData, i ); 
        pInfo[0] <<= 1;
    }
    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
    }
}